

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::ChromeProcessDescriptor::ParseFromArray
          (ChromeProcessDescriptor *this,void *raw,size_t size)

{
  uint64_t uVar1;
  undefined1 uVar2;
  uint uVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  uint64_t *puVar6;
  uint64_t uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t *end;
  ulong uVar10;
  uint64_t int_value;
  uint64_t payload_length;
  uint64_t preamble;
  uint32_t local_60;
  ushort local_5c;
  uint8_t local_5a;
  ChromeProcessDescriptor *local_58;
  string *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  bitset<6UL> *local_40;
  uint64_t payload_length_1;
  
  local_48 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  end = (uint64_t *)(size + (long)raw);
  uVar9 = 0;
  local_58 = this;
  do {
    if (end <= raw) goto switchD_002da667_caseD_3;
    preamble = 0;
    if ((long)(char)*raw < 0) {
      puVar6 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&preamble);
      if (puVar6 != (uint64_t *)raw) goto LAB_002da630;
LAB_002da9b5:
      uVar9 = 0;
      uVar7 = 0;
      goto LAB_002da75f;
    }
    puVar6 = (uint64_t *)((long)raw + 1);
    preamble = (long)(char)*raw;
LAB_002da630:
    uVar1 = preamble;
    uVar10 = preamble >> 3;
    uVar3 = (uint)uVar10;
    if ((uVar3 == 0) || (end <= puVar6)) goto LAB_002da9b5;
    int_value = 0;
    switch((uint)preamble & 7) {
    case 0:
      puVar5 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar6,(uint8_t *)end,&int_value);
      uVar8 = 0;
      uVar7 = 0;
      if (puVar5 == puVar6) goto LAB_002da75f;
      break;
    case 1:
      puVar5 = puVar6 + 1;
      if (end < puVar5) goto switchD_002da667_caseD_3;
      int_value = *puVar6;
LAB_002da6b3:
      uVar8 = 0;
      break;
    case 2:
      puVar4 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar6,(uint8_t *)end,&payload_length)
      ;
      if ((puVar4 == puVar6) || ((ulong)((long)end - (long)puVar4) < payload_length))
      goto switchD_002da667_caseD_3;
      puVar5 = (uint64_t *)((long)puVar4 + payload_length);
      uVar8 = payload_length;
      int_value = (uint64_t)puVar4;
      break;
    default:
      goto switchD_002da667_caseD_3;
    case 5:
      puVar5 = (uint64_t *)((long)puVar6 + 4);
      if (puVar5 <= end) {
        int_value = (uint64_t)(uint)*puVar6;
        goto LAB_002da6b3;
      }
      goto switchD_002da667_caseD_3;
    }
    raw = puVar5;
  } while ((0xffff < uVar3) || (0xfffffff < uVar8));
  uVar9 = uVar8 | (uVar1 & 7) << 0x30 | uVar10 << 0x20;
  uVar7 = int_value;
LAB_002da75f:
  local_40 = &local_58->_has_field_;
  local_50 = &local_58->host_app_package_name_;
LAB_002da77e:
  do {
    preamble = uVar7;
    local_60 = (uint32_t)uVar9;
    local_5a = (uint8_t)(uVar9 >> 0x30);
    uVar3 = (uint)(uVar9 >> 0x20);
    local_5c = (ushort)(uVar9 >> 0x20);
    if (local_5c == 0) {
      return end == (uint64_t *)raw;
    }
    if (local_5c < 6) {
      std::bitset<6UL>::set(local_40,(ulong)(uVar3 & 7),true);
      uVar3 = (uint)local_5c;
    }
    uVar3 = (uVar3 & 0xffff) - 1;
    if (uVar3 < 5) {
      uVar2 = (*(code *)(&DAT_0037aaac + *(int *)(&DAT_0037aaac + (ulong)uVar3 * 4)))();
      return (bool)uVar2;
    }
    protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
              ((Field *)&preamble,local_48);
    do {
      if (end <= raw) {
LAB_002da992:
        uVar9 = 0;
        uVar7 = 0;
        goto LAB_002da77e;
      }
      int_value = 0;
      if ((long)(char)*raw < 0) {
        puVar6 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&int_value);
        if (puVar6 == (uint64_t *)raw) goto LAB_002da992;
      }
      else {
        puVar6 = (uint64_t *)((long)raw + 1);
        int_value = (long)(char)*raw;
      }
      uVar1 = int_value;
      uVar10 = int_value >> 3;
      uVar3 = (uint)uVar10;
      if ((uVar3 == 0) || (end <= puVar6)) goto LAB_002da992;
      payload_length = 0;
      switch((uint)int_value & 7) {
      case 0:
        puVar5 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar6,(uint8_t *)end,&payload_length);
        uVar8 = 0;
        uVar9 = 0;
        uVar7 = 0;
        if (puVar5 == puVar6) goto LAB_002da77e;
        break;
      case 1:
        puVar5 = puVar6 + 1;
        if (end < puVar5) goto switchD_002da89c_caseD_3;
        payload_length = *puVar6;
LAB_002da8f5:
        uVar8 = 0;
        break;
      case 2:
        puVar4 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar6,(uint8_t *)end,&payload_length_1);
        if ((puVar4 == puVar6) || ((ulong)((long)end - (long)puVar4) < payload_length_1))
        goto switchD_002da89c_caseD_3;
        puVar5 = (uint64_t *)((long)puVar4 + payload_length_1);
        uVar8 = payload_length_1;
        payload_length = (uint64_t)puVar4;
        break;
      default:
        goto switchD_002da89c_caseD_3;
      case 5:
        puVar5 = (uint64_t *)((long)puVar6 + 4);
        if (puVar5 <= end) {
          payload_length = (uint64_t)(uint)*puVar6;
          goto LAB_002da8f5;
        }
        goto switchD_002da89c_caseD_3;
      }
      raw = puVar5;
    } while ((0xffff < uVar3) || (0xfffffff < uVar8));
    uVar9 = uVar8 | (uVar1 & 7) << 0x30 | uVar10 << 0x20;
    uVar7 = payload_length;
  } while( true );
switchD_002da667_caseD_3:
  uVar9 = 0;
  uVar7 = 0;
  goto LAB_002da75f;
switchD_002da89c_caseD_3:
  uVar9 = 0;
  uVar7 = 0;
  goto LAB_002da77e;
}

Assistant:

bool ChromeProcessDescriptor::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* process_type */:
        field.get(&process_type_);
        break;
      case 2 /* process_priority */:
        field.get(&process_priority_);
        break;
      case 3 /* legacy_sort_index */:
        field.get(&legacy_sort_index_);
        break;
      case 4 /* host_app_package_name */:
        field.get(&host_app_package_name_);
        break;
      case 5 /* crash_trace_id */:
        field.get(&crash_trace_id_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}